

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O1

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::Unroll
          (LoopUnrollerUtilsImpl *this,Loop *loop,size_t factor)

{
  pointer *pppIVar1;
  pointer pOVar2;
  pointer ppBVar3;
  BasicBlock *pBVar4;
  Instruction *pIVar5;
  iterator iVar6;
  LoopUnrollerUtilsImpl *this_00;
  _Hash_node_base *p_Var7;
  pointer ppIVar8;
  array<signed_char,_4UL> aVar9;
  array<signed_char,_4UL> aVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  Instruction *pIVar13;
  ulong uVar14;
  mapped_type *pmVar15;
  mapped_type *ppIVar16;
  ulong uVar17;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  Instruction *phi;
  _Hash_node_base *p_Var18;
  Loop *loop_00;
  Instruction *inst;
  pointer ppBVar19;
  pointer ppIVar20;
  size_t sVar21;
  Instruction *induction_clone;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions;
  uint32_t local_1c4;
  Loop *local_1c0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1b8;
  Instruction *local_1b0;
  size_t local_1a8;
  vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *local_1a0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_198;
  Instruction **local_190;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_188;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_180;
  size_t local_178;
  vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *local_170;
  undefined1 local_168 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Stack_148;
  undefined8 local_140;
  long lStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  BasicBlock *local_100;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_c0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_88;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  local_1a8 = factor;
  pIVar13 = BasicBlock::GetLoopMergeInst(loop->loop_header_);
  if (pIVar13 == (Instruction *)0x0) {
    __assert_fail("loop_merge_inst && \"Loop merge instruction could not be found after entering unroller \" \"(should have exited before this)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp"
                  ,0x20b,
                  "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::MarkLoopControlAsDontUnroll(Loop *) const"
                 );
  }
  local_168._24_8_ = local_168 + 0x10;
  local_168._0_8_ = &PTR__SmallVector_00b15d78;
  _Stack_148._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_168._16_4_ = (array<signed_char,_4UL>)0x2;
  local_168._8_8_ = (pointer)0x1;
  uVar17 = (ulong)(pIVar13->has_result_id_ & 1) + 1;
  if (pIVar13->has_type_id_ == false) {
    uVar17 = (ulong)pIVar13->has_result_id_;
  }
  uVar17 = uVar17 + 2;
  pOVar2 = (pIVar13->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar14 = ((long)(pIVar13->operands_).
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
           -0x5555555555555555;
  if (uVar14 < uVar17 || uVar14 - uVar17 == 0) {
LAB_005bb625:
    local_168._24_8_ = local_168 + 0x10;
    _Stack_148._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_168._8_8_ = (pointer)0x1;
    local_168._0_8_ = &PTR__SmallVector_00b15d78;
    __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2b8,
                  "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)");
  }
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)
             ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
             (ulong)(uint)((int)uVar17 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_168);
  local_168._0_8_ = &PTR__SmallVector_00b15d78;
  if (_Stack_148._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &_Stack_148,_Stack_148._M_head_impl);
  }
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Loop::GetInductionVariables(loop,&local_48);
  local_168._24_8_ =
       local_48.
       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_168._16_8_ =
       local_48.
       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_168._8_8_ =
       local_48.
       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uStack_128 = this->loop_condition_block_;
  local_168._0_8_ = this->loop_induction_variable_;
  local_130 = loop->loop_latch_;
  local_f8._M_buckets = &local_f8._M_single_bucket;
  local_c0._M_buckets = &local_c0._M_single_bucket;
  local_88._M_buckets = &local_88._M_single_bucket;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_single_bucket = (__node_base_ptr)0x0;
  local_88._M_rehash_policy._M_next_resize = 0;
  local_88._M_rehash_policy._M_max_load_factor = 1.0;
  local_88._M_element_count = 0;
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88._M_bucket_count = 1;
  local_c0._M_single_bucket = (__node_base_ptr)0x0;
  local_c0._M_rehash_policy._M_next_resize = 0;
  local_c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_c0._M_element_count = 0;
  local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c0._M_bucket_count = 1;
  local_f8._M_single_bucket = (__node_base_ptr)0x0;
  local_f8._M_rehash_policy._M_next_resize = 0;
  local_f8._M_rehash_policy._M_max_load_factor = 1.0;
  local_f8._M_element_count = 0;
  local_f8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f8._M_bucket_count = 1;
  uStack_108 = 0;
  local_110 = 0;
  uStack_118 = 0;
  local_120 = 0;
  lStack_138 = 0;
  local_140 = 0;
  _Stack_148._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  (this->state_).previous_phi_ = (Instruction *)local_168._0_8_;
  local_180 = &(this->state_).previous_phis_;
  local_1c0 = loop;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  _M_move_assign(local_180,local_168 + 8);
  local_1a0 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
              &(this->state_).new_phis_;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  _M_move_assign((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)local_1a0,&_Stack_148);
  (this->state_).new_latch_block = local_100;
  *(undefined4 *)&(this->state_).new_condition_block = (undefined4)local_110;
  *(undefined4 *)((long)&(this->state_).new_condition_block + 4) = local_110._4_4_;
  *(undefined4 *)&(this->state_).new_header_block = (undefined4)uStack_108;
  *(undefined4 *)((long)&(this->state_).new_header_block + 4) = uStack_108._4_4_;
  *(undefined4 *)&(this->state_).new_phi = (undefined4)local_120;
  *(undefined4 *)((long)&(this->state_).new_phi + 4) = local_120._4_4_;
  *(undefined4 *)&(this->state_).new_continue_block = (undefined4)uStack_118;
  *(undefined4 *)((long)&(this->state_).new_continue_block + 4) = uStack_118._4_4_;
  *(undefined4 *)&(this->state_).previous_latch_block_ = (undefined4)local_130;
  *(undefined4 *)((long)&(this->state_).previous_latch_block_ + 4) = local_130._4_4_;
  *(undefined4 *)&(this->state_).previous_condition_block_ = (undefined4)uStack_128;
  *(undefined4 *)((long)&(this->state_).previous_condition_block_ + 4) = uStack_128._4_4_;
  local_188 = &(this->state_).new_blocks._M_h;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(local_188,&local_f8);
  local_1b8 = &(this->state_).new_inst._M_h;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(local_1b8,&local_c0);
  local_198 = &(this->state_).ids_to_new_inst._M_h;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(local_198,&local_88);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_88);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_c0);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_f8);
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )_Stack_148._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    operator_delete(_Stack_148._M_head_impl,lStack_138 - (long)_Stack_148._M_head_impl);
  }
  loop_00 = local_1c0;
  if ((Instruction *)local_168._8_8_ != (Instruction *)0x0) {
    operator_delete((void *)local_168._8_8_,local_168._24_8_ - local_168._8_8_);
  }
  local_1a8 = local_1a8 - 1;
  if (local_1a8 != 0) {
    local_170 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
                &this->invalidated_instructions_;
    local_190 = &(this->state_).new_phi;
    sVar21 = 0;
    do {
      ppBVar3 = (this->loop_blocks_inorder_).
                super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_178 = sVar21;
      for (ppBVar19 = (this->loop_blocks_inorder_).
                      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppBVar19 != ppBVar3;
          ppBVar19 = ppBVar19 + 1) {
        CopyBasicBlock(this,loop_00,*ppBVar19,false);
      }
      pBVar4 = (this->state_).previous_latch_block_;
      pIVar13 = (pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      if ((pIVar13 == (Instruction *)0x0) ||
         ((pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
LAB_005bb644:
        __assert_fail("!insts_.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                      ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
      }
      pIVar13 = (pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
      pIVar5 = (((this->state_).new_header_block)->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      aVar9._M_elems[0] = '\0';
      aVar9._M_elems[1] = '\0';
      aVar9._M_elems[2] = '\0';
      aVar9._M_elems[3] = '\0';
      if (pIVar5->has_result_id_ == true) {
        aVar9._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_)
        ;
      }
      local_168._0_8_ = &PTR__SmallVector_00b15d78;
      _Stack_148._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_168._16_4_ = aVar9._M_elems;
      local_168._8_8_ = (Instruction *)0x1;
      uVar17 = (ulong)(pIVar13->has_result_id_ & 1) + 1;
      if (pIVar13->has_type_id_ == false) {
        uVar17 = (ulong)pIVar13->has_result_id_;
      }
      pOVar2 = (pIVar13->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(pIVar13->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
               -0x5555555555555555;
      if (uVar14 < uVar17 || uVar14 - uVar17 == 0) goto LAB_005bb625;
      local_168._24_8_ = local_168 + 0x10;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
                 (ulong)(uint)((int)uVar17 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_168);
      local_168._0_8_ = &PTR__SmallVector_00b15d78;
      if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
          _Stack_148._M_head_impl !=
          (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &_Stack_148,_Stack_148._M_head_impl);
      }
      if ((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::UpdateDefUse
                  ((this->context_->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,pIVar13);
      }
      pBVar4 = (this->state_).new_latch_block;
      pIVar13 = (pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      if ((pIVar13 == (Instruction *)0x0) ||
         ((pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
      goto LAB_005bb644;
      pIVar13 = (pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
      pIVar5 = (local_1c0->loop_header_->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      aVar10._M_elems[0] = '\0';
      aVar10._M_elems[1] = '\0';
      aVar10._M_elems[2] = '\0';
      aVar10._M_elems[3] = '\0';
      if (pIVar5->has_result_id_ == true) {
        aVar10._M_elems =
             (_Type)Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
      }
      local_168._0_8_ = &PTR__SmallVector_00b15d78;
      _Stack_148._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_168._16_4_ = aVar10._M_elems;
      local_168._8_8_ = (pointer)0x1;
      uVar17 = (ulong)(pIVar13->has_result_id_ & 1) + 1;
      if (pIVar13->has_type_id_ == false) {
        uVar17 = (ulong)pIVar13->has_result_id_;
      }
      pOVar2 = (pIVar13->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(pIVar13->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
               -0x5555555555555555;
      if (uVar14 < uVar17 || uVar14 - uVar17 == 0) goto LAB_005bb625;
      local_168._24_8_ = local_168 + 0x10;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
                 (ulong)(uint)((int)uVar17 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_168);
      local_168._0_8_ = &PTR__SmallVector_00b15d78;
      if (_Stack_148._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &_Stack_148,_Stack_148._M_head_impl);
      }
      IRContext::AnalyzeUses(this->context_,pIVar13);
      local_168._0_8_ = (Instruction *)0x0;
      local_168._8_8_ = (Instruction *)0x0;
      local_168._16_4_ = (array<signed_char,_4UL>)0x0;
      local_168._20_4_ = (array<signed_char,_4UL>)0x0;
      Loop::GetInductionVariables
                (local_1c0,
                 (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)local_168);
      uVar11 = extraout_EDX;
      if (local_168._8_8_ != local_168._0_8_) {
        uVar17 = 0;
        do {
          pIVar13 = (Instruction *)
                    (&((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_168._0_8_)->
                      _vptr_IntrusiveNodeBase)[uVar17];
          if ((pIVar13->has_result_id_ != true) ||
             (uVar11 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_),
             uVar11 == 0)) {
            __assert_fail("primary_copy->result_id() != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp"
                          ,0x2ba,
                          "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::CopyBody(Loop *, bool)"
                         );
          }
          uVar11 = 0;
          if (pIVar13->has_result_id_ == true) {
            uVar11 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
          }
          local_1b0 = (Instruction *)CONCAT44(local_1b0._4_4_,uVar11);
          pmVar15 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)local_1b8,(key_type *)&local_1b0);
          ppIVar16 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_198,pmVar15);
          local_1b0 = *ppIVar16;
          iVar6._M_current =
               (this->state_).new_phis_.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->state_).new_phis_.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
            _M_realloc_insert<spvtools::opt::Instruction*const&>(local_1a0,iVar6,&local_1b0);
          }
          else {
            *iVar6._M_current = local_1b0;
            pppIVar1 = &(this->state_).new_phis_.
                        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppIVar1 = *pppIVar1 + 1;
          }
          if ((local_1b0->has_result_id_ != true) ||
             (uVar11 = Instruction::GetSingleWordOperand(local_1b0,(uint)local_1b0->has_type_id_),
             uVar11 == 0)) {
            __assert_fail("induction_clone->result_id() != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp"
                          ,0x2bf,
                          "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::CopyBody(Loop *, bool)"
                         );
          }
          ppIVar20 = (this->state_).previous_phis_.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppIVar20 ==
              (this->state_).previous_phis_.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            uVar11 = 0;
            if (pIVar13->has_result_id_ == true) {
              uVar11 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
            }
            uVar12 = 0;
            if (pIVar13->has_result_id_ == true) {
              uVar12 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
            }
            local_1c4 = uVar12;
            pmVar15 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_1b8,&local_1c4);
            *pmVar15 = uVar11;
            uVar11 = extraout_EDX_03;
          }
          else {
            this_00 = (LoopUnrollerUtilsImpl *)ppIVar20[uVar17];
            pIVar5 = (((this->state_).previous_latch_block_)->label_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
            uVar12 = 0;
            phi = (Instruction *)0x0;
            uVar11 = extraout_EDX_00;
            if (pIVar5->has_result_id_ == true) {
              uVar11 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
              phi = (Instruction *)(ulong)uVar11;
              uVar11 = extraout_EDX_01;
            }
            uVar11 = GetPhiDefID(this_00,phi,uVar11);
            if (pIVar13->has_result_id_ == true) {
              uVar12 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
            }
            local_1c4 = uVar12;
            pmVar15 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_1b8,&local_1c4);
            *pmVar15 = uVar11;
            uVar11 = extraout_EDX_02;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < (ulong)((long)(local_168._8_8_ - local_168._0_8_) >> 3));
      }
      pBVar4 = (this->state_).new_condition_block;
      if (pBVar4 != this->loop_condition_block_) {
        FoldConditionBlock(this,pBVar4,uVar11);
      }
      pIVar13 = (local_1c0->loop_header_->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar12 = 0;
      uVar11 = 0;
      if (pIVar13->has_result_id_ == true) {
        uVar11 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
      }
      pIVar13 = (local_1c0->loop_header_->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar13->has_result_id_ == true) {
        uVar12 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
      }
      local_1b0 = (Instruction *)CONCAT44(local_1b0._4_4_,uVar12);
      pmVar15 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_1b8,(key_type *)&local_1b0);
      *pmVar15 = uVar11;
      for (p_Var18 = (this->state_).new_blocks._M_h._M_before_begin._M_nxt; loop_00 = local_1c0,
          p_Var18 != (_Hash_node_base *)0x0; p_Var18 = p_Var18->_M_nxt) {
        p_Var7 = p_Var18[2]._M_nxt;
        for (pIVar13 = (Instruction *)p_Var7[4]._M_nxt; pIVar13 != (Instruction *)(p_Var7 + 3);
            pIVar13 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
          RemapOperands(this,pIVar13);
        }
      }
      ppIVar8 = (this->state_).new_phis_.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar20 = (this->state_).new_phis_.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppIVar20 != ppIVar8;
          ppIVar20 = ppIVar20 + 1) {
        local_1b0 = *ppIVar20;
        iVar6._M_current =
             (this->invalidated_instructions_).
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->invalidated_instructions_).
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          _M_realloc_insert<spvtools::opt::Instruction*const&>(local_170,iVar6,&local_1b0);
        }
        else {
          *iVar6._M_current = local_1b0;
          pppIVar1 = &(this->invalidated_instructions_).
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar1 = *pppIVar1 + 1;
        }
      }
      (this->state_).previous_phi_ = (this->state_).new_phi;
      (this->state_).previous_latch_block_ = (this->state_).new_latch_block;
      (this->state_).previous_condition_block_ = (this->state_).new_condition_block;
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      _M_move_assign(local_180,local_1a0);
      local_190[2] = (Instruction *)0x0;
      local_190[3] = (Instruction *)0x0;
      *local_190 = (Instruction *)0x0;
      local_190[1] = (Instruction *)0x0;
      local_190[4] = (Instruction *)0x0;
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(local_188);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(local_1b8);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(local_198);
      sVar21 = local_178;
      if ((Instruction *)local_168._0_8_ != (Instruction *)0x0) {
        operator_delete((void *)local_168._0_8_,local_168._16_8_ - local_168._0_8_);
      }
      sVar21 = sVar21 + 1;
    } while (sVar21 != local_1a8);
  }
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::Unroll(Loop* loop, size_t factor) {
  // If we unroll a loop partially it will not be safe to unroll it further.
  // This is due to the current method of calculating the number of loop
  // iterations.
  MarkLoopControlAsDontUnroll(loop);

  std::vector<Instruction*> inductions;
  loop->GetInductionVariables(inductions);
  state_ = LoopUnrollState{loop_induction_variable_, loop->GetLatchBlock(),
                           loop_condition_block_, std::move(inductions)};
  for (size_t i = 0; i < factor - 1; ++i) {
    CopyBody(loop, true);
  }
}